

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDsd.c
# Opt level: O1

void Ivy_TruthTestOne(uint uTruth)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  uint in_EDI;
  uint local_14;
  
  local_14 = in_EDI;
  if (Ivy_TruthTestOne::vTree == (Vec_Int_t *)0x0) {
    pVVar3 = (Vec_Int_t *)malloc(0x10);
    pVVar3->nCap = 0x10;
    pVVar3->nSize = 0;
    piVar4 = (int *)malloc(0x40);
    pVVar3->pArray = piVar4;
    Ivy_TruthTestOne::vTree = pVVar3;
  }
  iVar1 = Ivy_TruthDsd(in_EDI,Ivy_TruthTestOne::vTree);
  if (iVar1 != 0) {
    Ivy_TruthTestOne::Counter = Ivy_TruthTestOne::Counter + 1;
    printf("%5d : ");
    Extra_PrintBinary(_stdout,&local_14,0x20);
    printf("  ");
    Ivy_TruthDsdPrint(_stdout,Ivy_TruthTestOne::vTree);
    uVar2 = Ivy_TruthDsdCompute_rec(Ivy_TruthTestOne::vTree->nSize + -1,Ivy_TruthTestOne::vTree);
    if (local_14 != uVar2) {
      puts("Verification failed.");
    }
  }
  return;
}

Assistant:

void Ivy_TruthTestOne( unsigned uTruth )
{
    static int Counter = 0;
    static Vec_Int_t * vTree = NULL;
    // decompose
    if ( vTree == NULL )
        vTree = Vec_IntAlloc( 12 );

    if ( !Ivy_TruthDsd( uTruth, vTree ) )
    {
//        printf( "Undecomposable\n" );
    }
    else
    {
//        nTruthDsd++;
        printf( "%5d : ", Counter++ );
        Extra_PrintBinary( stdout, &uTruth, 32 );
        printf( "  " );
        Ivy_TruthDsdPrint( stdout, vTree );
        if ( uTruth != Ivy_TruthDsdCompute(vTree) )
            printf( "Verification failed.\n" );
    }
//    Vec_IntFree( vTree );
}